

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# city.cc
# Opt level: O0

uint64_t absl::lts_20250127::hash_internal::CityHash64WithSeeds
                   (char *s,size_t len,uint64_t seed0,uint64_t seed1)

{
  uint64_t uVar1;
  uint64_t seed1_local;
  uint64_t seed0_local;
  size_t len_local;
  char *s_local;
  
  uVar1 = CityHash64(s,len);
  uVar1 = HashLen16(uVar1 - seed0,seed1);
  return uVar1;
}

Assistant:

uint64_t CityHash64WithSeeds(const char *s, size_t len, uint64_t seed0,
                             uint64_t seed1) {
  return HashLen16(CityHash64(s, len) - seed0, seed1);
}